

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O0

_Bool hostmatch(char *hostname,size_t hostlen,char *pattern,size_t patternlen)

{
  _Bool _Var1;
  int iVar2;
  void *pvVar3;
  char *pattern_00;
  char *pcVar4;
  size_t max;
  size_t skiplen;
  size_t skiphost;
  size_t suffixlen;
  size_t prefixlen;
  char *hostname_label_end;
  char *wildcard;
  char *pattern_label_end;
  size_t patternlen_local;
  char *pattern_local;
  size_t hostlen_local;
  char *hostname_local;
  
  pattern_local = (char *)hostlen;
  if (hostname[hostlen - 1] == '.') {
    pattern_local = (char *)(hostlen - 1);
  }
  pattern_label_end = (char *)patternlen;
  if (pattern[patternlen - 1] == '.') {
    pattern_label_end = (char *)(patternlen - 1);
  }
  pvVar3 = memchr(pattern,0x2a,(size_t)pattern_label_end);
  if (pvVar3 == (void *)0x0) {
    hostname_local._7_1_ = pmatch(hostname,(size_t)pattern_local,pattern,(size_t)pattern_label_end);
  }
  else {
    _Var1 = Curl_host_is_ipnum(hostname);
    if (_Var1) {
      hostname_local._7_1_ = false;
    }
    else {
      pattern_00 = (char *)memchr(pattern,0x2e,(size_t)pattern_label_end);
      if (((pattern_00 == (char *)0x0) ||
          (pcVar4 = (char *)Curl_memrchr(pattern,0x2e,(size_t)pattern_label_end),
          pcVar4 == pattern_00)) || (iVar2 = Curl_strncasecompare(pattern,"xn--",4), iVar2 != 0)) {
        hostname_local._7_1_ =
             pmatch(hostname,(size_t)pattern_local,pattern,(size_t)pattern_label_end);
      }
      else {
        pcVar4 = (char *)memchr(hostname,0x2e,(size_t)pattern_local);
        if (pcVar4 == (char *)0x0) {
          hostname_local._7_1_ = false;
        }
        else {
          _Var1 = pmatch(pcVar4,(long)pattern_local - ((long)pcVar4 - (long)hostname),pattern_00,
                         (long)pattern_label_end - ((long)pattern_00 - (long)pattern));
          if (_Var1) {
            if ((long)pcVar4 - (long)hostname < (long)pattern_00 - (long)pattern) {
              hostname_local._7_1_ = false;
            }
            else {
              max = (long)pattern_00 - ((long)pvVar3 + 1);
              iVar2 = Curl_strncasecompare(pattern,hostname,(long)pvVar3 - (long)pattern);
              hostname_local._7_1_ = false;
              if (iVar2 != 0) {
                iVar2 = Curl_strncasecompare((char *)((long)pvVar3 + 1),pcVar4 + -max,max);
                hostname_local._7_1_ = iVar2 != 0;
              }
            }
          }
          else {
            hostname_local._7_1_ = false;
          }
        }
      }
    }
  }
  return hostname_local._7_1_;
}

Assistant:

static bool hostmatch(const char *hostname,
                      size_t hostlen,
                      const char *pattern,
                      size_t patternlen)
{
  const char *pattern_label_end, *wildcard, *hostname_label_end;
  size_t prefixlen, suffixlen;

  /* normalize pattern and hostname by stripping off trailing dots */
  DEBUGASSERT(patternlen);
  if(hostname[hostlen-1]=='.')
    hostlen--;
  if(pattern[patternlen-1]=='.')
    patternlen--;

  wildcard = memchr(pattern, '*', patternlen);
  if(!wildcard)
    return pmatch(hostname, hostlen, pattern, patternlen);

  /* detect IP address as hostname and fail the match if so */
  if(Curl_host_is_ipnum(hostname))
    return FALSE;

  /* We require at least 2 dots in the pattern to avoid too wide wildcard
     match. */
  pattern_label_end = memchr(pattern, '.', patternlen);
  if(!pattern_label_end ||
     (memrchr(pattern, '.', patternlen) == pattern_label_end) ||
     strncasecompare(pattern, "xn--", 4))
    return pmatch(hostname, hostlen, pattern, patternlen);

  hostname_label_end = memchr(hostname, '.', hostlen);
  if(!hostname_label_end)
    return FALSE;
  else {
    size_t skiphost = hostname_label_end - hostname;
    size_t skiplen = pattern_label_end - pattern;
    if(!pmatch(hostname_label_end, hostlen - skiphost,
               pattern_label_end, patternlen - skiplen))
      return FALSE;
  }
  /* The wildcard must match at least one character, so the left-most
     label of the hostname is at least as large as the left-most label
     of the pattern. */
  if(hostname_label_end - hostname < pattern_label_end - pattern)
    return FALSE;

  prefixlen = wildcard - pattern;
  suffixlen = pattern_label_end - (wildcard + 1);
  return strncasecompare(pattern, hostname, prefixlen) &&
    strncasecompare(wildcard + 1, hostname_label_end - suffixlen,
                    suffixlen) ? TRUE : FALSE;
}